

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O0

int Search::random_policy
              (search_private *priv,bool allow_current,bool allow_optimal,bool advance_prng)

{
  int iVar1;
  ostream *poVar2;
  byte in_CL;
  byte bVar3;
  byte in_DL;
  byte bVar4;
  byte in_SIL;
  long in_RDI;
  float fVar5;
  float r;
  int pid;
  int num_valid_policies;
  undefined4 in_stack_ffffffffffffffd0;
  float fVar6;
  undefined4 in_stack_ffffffffffffffd4;
  float local_28;
  float local_24;
  float local_20;
  uint local_1c;
  int local_4;
  
  bVar4 = in_SIL & 1;
  bVar3 = in_DL & 1;
  if (*(float *)(in_RDI + 0x290) < 1.0) {
    iVar1 = *(int *)(in_RDI + 0x2b0) + (uint)bVar3 + (uint)bVar4;
    if (iVar1 == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,
                               "internal error (bug): no valid policies to choose from!  defaulting to current"
                              );
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      local_4 = *(int *)(in_RDI + 0x2b0);
    }
    else {
      if (iVar1 == 1) {
        local_1c = 0;
      }
      else if (iVar1 == 2) {
        if ((in_CL & 1) == 0) {
          local_24 = merand48_noadvance(0x3aebda);
        }
        else {
          local_24 = merand48((uint64_t *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
        local_1c = (uint)(*(float *)(in_RDI + 0x290) <= local_24);
      }
      else {
        if ((in_CL & 1) == 0) {
          local_28 = merand48_noadvance(0x3aec3a);
        }
        else {
          local_28 = merand48((uint64_t *)
                              CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
        }
        local_1c = 0;
        if (*(float *)(in_RDI + 0x290) <= local_28 && local_28 != *(float *)(in_RDI + 0x290)) {
          for (local_20 = local_28 - *(float *)(in_RDI + 0x290);
              0.0 < local_20 && (int)local_1c < iVar1 + -1; local_20 = -fVar6 * fVar5 + local_20) {
            local_1c = local_1c + 1;
            fVar6 = *(float *)(in_RDI + 0x290);
            fVar5 = powf(1.0 - *(float *)(in_RDI + 0x290),(float)(int)local_1c);
          }
        }
      }
      if ((bVar3 == 0) || (local_1c != iVar1 - 1U)) {
        local_1c = *(int *)(in_RDI + 0x2b0) - local_1c;
        if (bVar4 == 0) {
          local_1c = local_1c + -1;
        }
        local_4 = local_1c;
      }
      else {
        local_4 = -1;
      }
    }
  }
  else if (bVar4 == 0) {
    if (*(int *)(in_RDI + 0x2b0) == 0) {
      if (bVar3 == 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,
                                 "internal error (bug): no valid policies to choose from!  defaulting to current"
                                );
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        local_4 = *(int *)(in_RDI + 0x2b0);
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = *(int *)(in_RDI + 0x2b0) + -1;
    }
  }
  else {
    local_4 = *(int *)(in_RDI + 0x2b0);
  }
  return local_4;
}

Assistant:

int random_policy(search_private& priv, bool allow_current, bool allow_optimal, bool advance_prng = true)
{
  if (priv.beta >= 1)
  {
    if (allow_current)
      return (int)priv.current_policy;
    if (priv.current_policy > 0)
      return (((int)priv.current_policy) - 1);
    if (allow_optimal)
      return -1;
    std::cerr << "internal error (bug): no valid policies to choose from!  defaulting to current" << std::endl;
    return (int)priv.current_policy;
  }

  int num_valid_policies = (int)priv.current_policy + allow_optimal + allow_current;
  int pid = -1;

  if (num_valid_policies == 0)
  {
    std::cerr << "internal error (bug): no valid policies to choose from!  defaulting to current" << std::endl;
    return (int)priv.current_policy;
  }
  else if (num_valid_policies == 1)
    pid = 0;
  else if (num_valid_policies == 2)
    pid = (advance_prng ? merand48(priv.all->random_state) : merand48_noadvance(priv.all->random_state)) >= priv.beta;
  else
  {
    // SPEEDUP this up in the case that beta is small!
    float r = (advance_prng ? merand48(priv.all->random_state) : merand48_noadvance(priv.all->random_state));
    pid = 0;

    if (r > priv.beta)
    {
      r -= priv.beta;
      while ((r > 0) && (pid < num_valid_policies - 1))
      {
        pid++;
        r -= priv.beta * powf(1.f - priv.beta, (float)pid);
      }
    }
  }
  // figure out which policy pid refers to
  if (allow_optimal && (pid == num_valid_policies - 1))
    return -1;  // this is the optimal policy

  pid = (int)priv.current_policy - pid;
  if (!allow_current)
    pid--;

  return pid;
}